

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_room_of_chambers(chunk *c,loc_conflict centre,wchar_t rating)

{
  wchar_t h;
  short sVar1;
  uint uVar2;
  bool bVar3;
  _Bool _Var4;
  int16_t iVar5;
  int16_t iVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  wchar_t wVar12;
  int iVar13;
  wchar_t wVar14;
  loc lVar15;
  loc lVar16;
  square *psVar17;
  loc lVar18;
  loc grid;
  loc grid_00;
  wchar_t *pwVar19;
  wchar_t wVar20;
  wchar_t w;
  ulong uVar21;
  wchar_t y;
  long lVar22;
  int iVar23;
  wchar_t wVar24;
  int iVar25;
  ulong uVar26;
  loc lVar27;
  wchar_t y1;
  wchar_t wVar28;
  ulong uVar29;
  int iVar30;
  wchar_t wVar31;
  wchar_t wVar32;
  char *name_00;
  wchar_t x2;
  wchar_t wVar33;
  ulong local_e8;
  loc_conflict centre_local;
  char name [40];
  
  centre_local = centre;
  wVar7 = Rand_div(0x2d);
  wVar14 = c->depth;
  iVar5 = m_bonus(0x14,wVar14);
  h = iVar5 + L'\x14';
  uVar8 = Rand_div(0x14);
  iVar6 = m_bonus(0x14,c->depth);
  w = uVar8 + (int)iVar6 + L'\x15';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,h,w);
  if ((centre.y < c->height) && (wVar28 = centre.y, centre.x < c->width)) {
LAB_00153b7d:
    y1 = h / -2 + wVar28;
    uVar26 = (ulong)(uint)y1;
    lVar27.x = w / -2 + centre.x;
    lVar27.y = L'\0';
    uVar29 = (long)(int)(uVar8 + (int)iVar6 + 0x14) / 2;
    lVar16 = (loc)(uVar29 & 0xffffffff);
    lVar15 = (loc)loc(lVar27.x,y1);
    _Var4 = square_in_bounds((chunk_conflict *)c,lVar15);
    if (_Var4) {
      wVar28 = wVar28 + (iVar5 + 0x13) / 2;
      x2 = centre.x + (int)uVar29;
      lVar15 = (loc)loc(x2,wVar28);
      _Var4 = square_in_bounds((chunk_conflict *)c,lVar15);
      iVar25 = 0;
      if (_Var4) {
        uVar9 = wVar28 - y1;
        uVar2 = -uVar9;
        if (0 < (int)uVar9) {
          uVar2 = uVar9;
        }
        uVar10 = x2 - lVar27.x;
        uVar9 = -uVar10;
        if (0 < (int)uVar10) {
          uVar9 = uVar10;
        }
        for (; local_e8 = uVar26, iVar25 != (uVar9 * uVar2) / 0x50 + 10; iVar25 = iVar25 + 1) {
          uVar8 = Rand_div(4);
          uVar11 = Rand_div(10);
          iVar30 = uVar8 + uVar11 + 3;
          uVar11 = Rand_div(4);
          iVar23 = uVar11 + uVar8 + 3;
          uVar8 = Rand_div(((wVar28 + L'\x01') - y1) - iVar23);
          wVar12 = uVar8 + y1;
          uVar11 = Rand_div(((x2 + L'\x01') - lVar27.x) - iVar30);
          wVar20 = uVar11 + lVar27.x;
          wVar24 = iVar23 + wVar12;
          if (wVar28 <= wVar24) {
            wVar24 = wVar28;
          }
          wVar31 = iVar30 + wVar20;
          if (x2 <= wVar31) {
            wVar31 = x2;
          }
          fill_rectangle(c,uVar8 + y1 + L'\x01',uVar11 + 1 + lVar27.x,wVar24 + L'\xffffffff',
                         wVar31 + L'\xffffffff',FEAT_MAGMA,L'\0');
          for (wVar32 = wVar12; wVar33 = wVar20, wVar32 <= wVar24; wVar32 = wVar32 + L'\x01') {
            make_inner_chamber_wall(c,wVar32,wVar20);
            make_inner_chamber_wall(c,wVar32,wVar31);
          }
          for (; wVar33 <= wVar31; wVar33 = wVar33 + L'\x01') {
            make_inner_chamber_wall(c,wVar12,wVar33);
            make_inner_chamber_wall(c,wVar24,wVar33);
          }
          iVar30 = wVar31 - wVar20;
          iVar23 = -iVar30;
          if (0 < iVar30) {
            iVar23 = iVar30;
          }
          iVar13 = wVar24 - wVar12;
          iVar30 = -iVar13;
          if (0 < iVar13) {
            iVar30 = iVar13;
          }
          lVar16.x = L'\0';
          lVar16.y = L'\0';
          while (wVar32 = lVar16.x, wVar32 != L'\x14') {
            uVar8 = Rand_div(2);
            uVar11 = Rand_div(2);
            if (uVar8 == 0) {
              wVar33 = wVar31;
              if (uVar11 == 0) {
                wVar33 = wVar20;
              }
              uVar8 = Rand_div(iVar30 + 1);
              y = uVar8 + wVar12;
            }
            else {
              y = wVar24;
              if (uVar11 == 0) {
                y = wVar12;
              }
              uVar8 = Rand_div(iVar23 + 1);
              wVar33 = uVar8 + wVar20;
            }
            lVar16 = (loc)loc(wVar33,y);
            _Var4 = square_iswall_inner((chunk_conflict *)c,lVar16);
            if (_Var4) {
              lVar16 = (loc)loc(wVar33,y);
              _Var4 = square_in_bounds_fully((chunk_conflict *)c,lVar16);
              if (_Var4) {
                lVar22 = 0;
                uVar10 = 0;
                while( true ) {
                  lVar16.x = ddy_ddd[lVar22] + y;
                  lVar16.y = L'\0';
                  sVar1 = ddx_ddd[lVar22];
                  lVar15 = (loc)loc(sVar1 + wVar33,lVar16.x);
                  psVar17 = square((chunk_conflict *)c,lVar15);
                  if (FEAT_OPEN == (uint)psVar17->feat) break;
                  lVar15 = (loc)loc(sVar1 + wVar33,lVar16.x);
                  _Var4 = square_iswall_inner((chunk_conflict *)c,lVar15);
                  uVar10 = uVar10 + _Var4;
                  if (3 < uVar10) break;
                  lVar22 = lVar22 + 1;
                  if (lVar22 == 9) {
                    lVar15 = (loc)loc(wVar33,y);
                    square_set_feat((chunk_conflict *)c,lVar15,FEAT_OPEN);
                    goto LAB_00153f28;
                  }
                }
              }
            }
            lVar16.x = wVar32 + L'\x01';
            lVar16.y = L'\0';
          }
LAB_00153f28:
        }
        for (; (wchar_t)local_e8 <= wVar28; local_e8 = (ulong)(uint)((wchar_t)local_e8 + L'\x01')) {
          lVar16 = lVar27;
          while (lVar16.x <= x2) {
            lVar15 = (loc)((ulong)lVar16 | local_e8 << 0x20);
            _Var4 = square_in_bounds_fully((chunk_conflict *)c,lVar15);
            if (_Var4) {
              iVar25 = 0;
              for (lVar22 = 0; lVar22 != 8; lVar22 = lVar22 + 1) {
                lVar18 = (loc)loc_sum((loc_conflict)lVar15,(loc_conflict)ddgrid_ddd[lVar22]);
                psVar17 = square((chunk_conflict *)c,lVar18);
                if ((FEAT_GRANITE == (uint)psVar17->feat) &&
                   (_Var4 = square_iswall_outer((chunk_conflict *)c,lVar18), !_Var4)) {
                  _Var4 = square_iswall_solid((chunk_conflict *)c,lVar18);
                  iVar25 = iVar25 + (uint)!_Var4;
                }
              }
              if (iVar25 == 5) {
                psVar17 = square((chunk_conflict *)c,lVar15);
                if (FEAT_MAGMA != (uint)psVar17->feat) {
LAB_0015403a:
                  set_marked_granite(c,(loc_conflict)lVar15,L'\v');
                }
              }
              else if (5 < iVar25) goto LAB_0015403a;
            }
            lVar16.x = lVar16.x + L'\x01';
            lVar16.y = L'\0';
          }
        }
        iVar25 = 0x33;
        do {
          iVar25 = iVar25 + -1;
          if (iVar25 == 0) break;
          uVar8 = Rand_div(uVar9 >> 1);
          uVar11 = Rand_div(uVar2 >> 1);
          lVar16 = (loc)loc(uVar8 + (uVar9 >> 2) + lVar27.x,uVar11 + (uVar2 >> 2) + y1);
          local_e8 = (ulong)lVar16 >> 0x20;
          psVar17 = square((chunk_conflict *)c,lVar16);
        } while (FEAT_MAGMA != (uint)psVar17->feat);
        lVar16 = (loc)((ulong)lVar16 & 0xffffffff | local_e8 << 0x20);
        square_set_feat((chunk_conflict *)c,lVar16,FEAT_FLOOR);
        hollow_out_room(c,(loc_conflict)lVar16);
        iVar25 = 0;
        do {
          if (iVar25 == 100) break;
          bVar3 = false;
          for (uVar29 = uVar26; (wchar_t)uVar29 < wVar28;
              uVar29 = (ulong)(uint)((wchar_t)uVar29 + L'\x01')) {
            lVar15 = lVar27;
            while (lVar15.x < x2) {
              lVar16 = (loc)((ulong)lVar15 | uVar29 << 0x20);
              psVar17 = square((chunk_conflict *)c,lVar16);
              if ((FEAT_MAGMA == (uint)psVar17->feat) &&
                 (_Var4 = square_in_bounds_fully((chunk_conflict *)c,lVar16), _Var4)) {
                for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
                  lVar18 = ddgrid_ddd[lVar22];
                  grid = (loc)loc_sum((loc_conflict)lVar16,(loc_conflict)lVar18);
                  _Var4 = square_iswall_inner((chunk_conflict *)c,grid);
                  if (_Var4) {
                    grid_00 = (loc)loc_sum((loc_conflict)grid,(loc_conflict)lVar18);
                    _Var4 = square_in_bounds((chunk_conflict *)c,grid_00);
                    if (_Var4) {
                      psVar17 = square((chunk_conflict *)c,grid_00);
                      if (FEAT_FLOOR == (uint)psVar17->feat) {
                        pwVar19 = &FEAT_BROKEN;
LAB_00154254:
                        square_set_feat((chunk_conflict *)c,grid,*pwVar19);
                        square_set_feat((chunk_conflict *)c,lVar16,FEAT_FLOOR);
                        hollow_out_room(c,(loc_conflict)lVar16);
                        bVar3 = true;
                        break;
                      }
                      _Var4 = square_iswall_inner((chunk_conflict *)c,grid_00);
                      if (_Var4) {
                        lVar18 = (loc)loc_sum((loc_conflict)grid_00,(loc_conflict)lVar18);
                        _Var4 = square_in_bounds((chunk_conflict *)c,lVar18);
                        if (_Var4) {
                          psVar17 = square((chunk_conflict *)c,lVar18);
                          if (FEAT_FLOOR == (uint)psVar17->feat) {
                            square_set_feat((chunk_conflict *)c,grid,(uint)psVar17->feat);
                            pwVar19 = &FEAT_FLOOR;
                            grid = grid_00;
                            goto LAB_00154254;
                          }
                        }
                      }
                    }
                  }
                }
              }
              lVar15.x = lVar15.x + L'\x01';
              lVar15.y = L'\0';
            }
          }
          iVar25 = iVar25 + 1;
        } while (bVar3);
        for (; (wchar_t)uVar26 <= wVar28; uVar26 = (ulong)(uint)((wchar_t)uVar26 + L'\x01')) {
          lVar18 = lVar27;
          while (lVar18.x <= x2) {
            lVar16 = (loc)((ulong)lVar18 | uVar26 << 0x20);
            psVar17 = square((chunk_conflict *)c,lVar16);
            if (FEAT_OPEN == (uint)psVar17->feat) {
              set_marked_granite(c,(loc_conflict)lVar16,L'\v');
            }
            else {
              psVar17 = square((chunk_conflict *)c,lVar16);
              if (FEAT_BROKEN == (uint)psVar17->feat) {
                place_random_door((chunk_conflict *)c,(loc_conflict)lVar16);
              }
            }
            lVar18.x = lVar18.x + L'\x01';
            lVar18.y = L'\0';
          }
        }
        wVar24 = L'\x01';
        if (L'\x01' < y1) {
          wVar24 = y1;
        }
        uVar29 = (ulong)(uint)(wVar24 + L'\xffffffff');
        wVar12 = wVar28 + L'\x02';
        wVar24 = L'\x01';
        if (L'\x01' < lVar27.x) {
          wVar24 = lVar27.x;
        }
        wVar20 = x2 + L'\x02';
        uVar26 = uVar29;
        while( true ) {
          wVar31 = c->height;
          wVar32 = wVar31;
          if (wVar12 < wVar31) {
            wVar32 = wVar12;
          }
          if ((long)wVar32 <= (long)uVar26) break;
          uVar21 = (ulong)(uint)(wVar24 + L'\xffffffff');
          while( true ) {
            wVar31 = c->width;
            if (wVar20 < c->width) {
              wVar31 = wVar20;
            }
            if ((long)wVar31 <= (long)uVar21) break;
            lVar16 = (loc)(uVar26 << 0x20 | uVar21);
            _Var4 = square_iswall_inner((chunk_conflict *)c,lVar16);
            if ((_Var4) ||
               (psVar17 = square((chunk_conflict *)c,lVar16), FEAT_MAGMA == (uint)psVar17->feat)) {
              for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
                lVar15 = (loc)loc_sum((loc_conflict)lVar16,(loc_conflict)ddgrid_ddd[lVar22]);
                _Var4 = square_in_bounds((chunk_conflict *)c,lVar15);
                if (_Var4) {
                  psVar17 = square((chunk_conflict *)c,lVar15);
                  if (FEAT_FLOOR == (uint)psVar17->feat) break;
                  if (lVar22 == 8) {
                    set_marked_granite(c,(loc_conflict)lVar16,L'\0');
                  }
                }
              }
            }
            _Var4 = square_isfloor((chunk_conflict *)c,lVar16);
            if (_Var4) {
              for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
                lVar15 = (loc)loc_sum((loc_conflict)lVar16,(loc_conflict)ddgrid_ddd[lVar22]);
                _Var4 = square_in_bounds((chunk_conflict *)c,lVar15);
                if (_Var4) {
                  psVar17 = square((chunk_conflict *)c,lVar15);
                  flag_on_dbg(psVar17->info,3,4,"square(c, grid1)->info","SQUARE_ROOM");
                  psVar17 = square((chunk_conflict *)c,lVar15);
                  flag_on_dbg(psVar17->info,3,0x14,"square(c, grid1)->info","SQUARE_NO_STAIRS");
                  if (wVar14 < wVar7) {
                    psVar17 = square((chunk_conflict *)c,lVar15);
                    flag_on_dbg(psVar17->info,3,2,"square(c, grid1)->info","SQUARE_GLOW");
                  }
                }
              }
            }
            uVar21 = uVar21 + 1;
          }
          uVar26 = uVar26 + 1;
        }
        while( true ) {
          if (wVar12 < wVar31) {
            wVar31 = wVar12;
          }
          if ((long)wVar31 <= (long)uVar29) break;
          uVar26 = (ulong)(uint)(wVar24 + L'\xffffffff');
          while( true ) {
            wVar14 = c->width;
            if (wVar20 < c->width) {
              wVar14 = wVar20;
            }
            if ((long)wVar14 <= (long)uVar26) break;
            lVar16 = (loc)(uVar29 << 0x20 | uVar26);
            _Var4 = square_in_bounds_fully((chunk_conflict *)c,lVar16);
            if ((_Var4) && (_Var4 = square_iswall_inner((chunk_conflict *)c,lVar16), _Var4)) {
              for (lVar22 = 0; lVar22 != 9; lVar22 = lVar22 + 1) {
                lVar15 = (loc)loc_sum((loc_conflict)lVar16,(loc_conflict)ddgrid_ddd[lVar22]);
                psVar17 = square((chunk_conflict *)c,lVar15);
                if ((((FEAT_GRANITE == (uint)psVar17->feat) &&
                     (_Var4 = square_iswall_inner((chunk_conflict *)c,lVar16), !_Var4)) &&
                    (_Var4 = square_iswall_outer((chunk_conflict *)c,lVar16), !_Var4)) &&
                   (_Var4 = square_iswall_solid((chunk_conflict *)c,lVar16), !_Var4)) {
                  set_marked_granite(c,(loc_conflict)lVar16,L'\f');
                  break;
                }
              }
            }
            uVar26 = uVar26 + 1;
          }
          uVar29 = uVar29 + 1;
          wVar31 = c->height;
        }
        name_00 = name;
        get_chamber_monsters(c,y1,lVar27.x,wVar28,x2,name_00,w * h);
        add_to_monster_rating(c,10);
        iVar25 = 1;
        if ((player->opts).opt[0x18] == true) {
          if (name[0] == '\0') {
            name_00 = "empty";
          }
          msg("Room of chambers (%s)",name_00);
          iVar25 = 1;
        }
      }
      goto LAB_00153f38;
    }
  }
  else {
    _Var4 = find_space(&centre_local,h,w);
    if (_Var4) {
      centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
      wVar28 = centre_local.y;
      goto LAB_00153b7d;
    }
  }
  iVar25 = 0;
LAB_00153f38:
  return SUB41(iVar25,0);
}

Assistant:

bool build_room_of_chambers(struct chunk *c, struct loc centre, int rating)
{
	int i, d;
	int area, num_chambers;
	int y1, x1, y2, x2;
	struct loc grid;
	int height, width, count;

	char name[40];

	/* Deeper in the dungeon, chambers are less likely to be lit. */
	bool light = (randint0(45) > c->depth) ? true : false;

	/* Calculate a level-dependent room size. */
	height = 20 + m_bonus(20, c->depth);
	width = 20 + randint1(20) + m_bonus(20, c->depth);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height, width);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height, width))
			return (false);
	}

	/* Calculate the borders of the room. */
	y1 = centre.y - (height / 2);
	x1 = centre.x - (width / 2);
	y2 = centre.y + (height - 1) / 2;
	x2 = centre.x + (width - 1) / 2;

	/* Make certain the room does not cross the dungeon edge. */
	if ((!square_in_bounds(c, loc(x1, y1))) || 
		(!square_in_bounds(c, loc(x2, y2))))
		return (false);

	/* Determine how much space we have. */
	area = ABS(y2 - y1) * ABS(x2 - x1);

	/* Calculate the number of smaller chambers to make. */
	num_chambers = 10 + area / 80;

	/* Build the chambers. */
	for (i = 0; i < num_chambers; i++) {
		int c_y1, c_x1, c_y2, c_x2;
		int size, width_local, height_local;

		/* Determine size of chamber. */
		size = 3 + randint0(4);
		width_local = size + randint0(10);
		height_local = size + randint0(4);

		/* Pick an upper-left corner at random. */
		c_y1 = y1 + randint0(1 + y2 - y1 - height_local);
		c_x1 = x1 + randint0(1 + x2 - x1 - width_local);

		/* Determine lower-right corner of chamber. */
		c_y2 = c_y1 + height_local;
		if (c_y2 > y2) c_y2 = y2;

		c_x2 = c_x1 + width_local;
		if (c_x2 > x2) c_x2 = x2;

		/* Make me a (magma filled) chamber. */
		make_chamber(c, c_y1, c_x1, c_y2, c_x2);
	}

	/* Remove useless doors, fill in tiny, narrow rooms. */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			count = 0;

			/* Stay legal. */
			if (!square_in_bounds_fully(c, grid))
				continue;

			/* Check all adjacent grids. */
			for (d = 0; d < 8; d++) {
				/* Extract adjacent location */
				struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

				/* Count the walls and dungeon granite. */
				if ((square(c, grid1)->feat == FEAT_GRANITE) &&
					(!square_iswall_outer(c, grid1)) &&
					(!square_iswall_solid(c, grid1)))
					count++;
			}

			/* Five adjacent walls: Change non-chamber to wall. */
			if ((count == 5) && (square(c, grid)->feat != FEAT_MAGMA))
				set_marked_granite(c, grid, SQUARE_WALL_INNER);

			/* More than five adjacent walls: Change anything to wall. */
			else if (count > 5)
				set_marked_granite(c, grid, SQUARE_WALL_INNER);
		}
	}

	/* Pick a random magma spot near the center of the room. */
	for (i = 0; i < 50; i++) {
		grid = loc(x1 + ABS(x2 - x1) / 4 + randint0(ABS(x2 - x1) / 2),
				   y1 + ABS(y2 - y1) / 4 + randint0(ABS(y2 - y1) / 2));
		if (square(c, grid)->feat == FEAT_MAGMA)
			break;
	}

	/* Hollow out the first room. */
	square_set_feat(c, grid, FEAT_FLOOR);
	hollow_out_room(c, grid);

	/* Attempt to change every in-room magma grid to open floor. */
	for (i = 0; i < 100; i++) {
		/* Assume this run will do no useful work. */
		bool joy = false;

		/* Make new doors and tunnels between magma and open floor. */
		for (grid.y = y1; grid.y < y2; grid.y++) {
			for (grid.x = x1; grid.x < x2; grid.x++) {
				/* Current grid must be magma. */
				if (square(c, grid)->feat != FEAT_MAGMA) continue;

				/* Stay legal. */
				if (!square_in_bounds_fully(c, grid)) continue;

				/* Check only horizontal and vertical directions. */
				for (d = 0; d < 4; d++) {
					struct loc grid1, grid2;

					/* Extract adjacent location */
					grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Need inner wall. */
					if (!square_iswall_inner(c, grid1)) 
						continue;

					/* Keep going in the same direction, if in bounds. */
					grid2 = loc_sum(grid1, ddgrid_ddd[d]);
					if (!square_in_bounds(c, grid2)) continue;

					/* If we find open floor, place a door. */
					if (square(c, grid2)->feat == FEAT_FLOOR) {
						joy = true;

						/* Make a broken door in the wall grid. */
						square_set_feat(c, grid1, FEAT_BROKEN);

						/* Hollow out the new room. */
						square_set_feat(c, grid, FEAT_FLOOR);
						hollow_out_room(c, grid);

						break;
					}

					/* If we find more inner wall... */
					if (square_iswall_inner(c, grid2)) {
						/* ...Keep going in the same direction. */
						struct loc grid3 = loc_sum(grid2, ddgrid_ddd[d]);
						if (!square_in_bounds(c, grid3)) continue;

						/* If we /now/ find floor, make a tunnel. */
						if (square(c, grid3)->feat == FEAT_FLOOR) {
							joy = true;

							/* Turn both wall grids into floor. */
							square_set_feat(c, grid1, FEAT_FLOOR);
							square_set_feat(c, grid2, FEAT_FLOOR);

							/* Hollow out the new room. */
							square_set_feat(c, grid, FEAT_FLOOR);
							hollow_out_room(c, grid);

							break;
						}
					}
				}
			}
		}

		/* If we could find no work to do, stop. */
		if (!joy) break;
	}


	/* Turn broken doors into a random kind of door, remove open doors. */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			if (square(c, grid)->feat == FEAT_OPEN)
				set_marked_granite(c, grid, SQUARE_WALL_INNER);
			else if (square(c, grid)->feat == FEAT_BROKEN)
				place_random_door(c, grid);
		}
	}


	/* Turn all walls and magma not adjacent to floor into dungeon granite. */
	/* Turn all floors and adjacent grids into rooms, sometimes lighting them */
	for (grid.y = (y1 - 1 > 0 ? y1 - 1 : 0);
		 grid.y < (y2 + 2 < c->height ? y2 + 2 : c->height); grid.y++) {
		for (grid.x = (x1 - 1 > 0 ? x1 - 1 : 0);
			 grid.x < (x2 + 2 < c->width ? x2 + 2 : c->width); grid.x++) {

			if (square_iswall_inner(c, grid)
				|| (square(c, grid)->feat == FEAT_MAGMA)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Stay legal */
					if (!square_in_bounds(c, grid1)) continue;

					/* No floors allowed */
					if (square(c, grid1)->feat == FEAT_FLOOR) break;

					/* Turn me into dungeon granite. */
					if (d == 8)
						set_marked_granite(c, grid, SQUARE_NONE);
				}
			}
			if (square_isfloor(c, grid)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Stay legal */
					if (!square_in_bounds(c, grid1)) continue;

					/* Turn into room, forbid stairs. */
					sqinfo_on(square(c, grid1)->info, SQUARE_ROOM);
					sqinfo_on(square(c, grid1)->info, SQUARE_NO_STAIRS);

					/* Illuminate if requested. */
					if (light) sqinfo_on(square(c, grid1)->info, SQUARE_GLOW);
				}
			}
		}
	}


	/* Turn all inner wall grids adjacent to dungeon granite into outer walls */
	for (grid.y = (y1 - 1 > 0 ? y1 - 1 : 0);
		 grid.y < (y2 + 2 < c->height ? y2 + 2 : c->height); grid.y++) {
		for (grid.x = (x1 - 1 > 0 ? x1 - 1 : 0);
			 grid.x < (x2 + 2 < c->width ? x2 + 2 : c->width); grid.x++) {

			/* Stay legal. */
			if (!square_in_bounds_fully(c, grid)) continue;

			if (square_iswall_inner(c, grid)) {
				for (d = 0; d < 9; d++) {
					/* Extract adjacent location */
					struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

					/* Look for dungeon granite */
					if ((square(c, grid1)->feat == FEAT_GRANITE) && 
						(!square_iswall_inner(c, grid)) &&
						(!square_iswall_outer(c, grid)) &&
						(!square_iswall_solid(c, grid)))
					{
						/* Turn me into outer wall. */
						set_marked_granite(c, grid, SQUARE_WALL_OUTER);

						/* Done; */
						break;
					}
				}
			}
		}
	}

	/*** Now we get to place the monsters. ***/
	get_chamber_monsters(c, y1, x1, y2, x2, name, height * width);

	/* Increase the level rating */
	add_to_monster_rating(c, 10);

	/* Describe */
	ROOM_LOG("Room of chambers (%s)", strlen(name) ? name : "empty");

	/* Success. */
	return (true);
}